

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall Executor::runThread(Executor *this)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  _List_node_base *p_Var1;
  Task task;
  unique_lock<std::mutex> lock;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  unique_lock<std::mutex> local_40;
  
  this_00 = &this->pendingTasks;
  while (this->closed == false) {
    local_58 = 0;
    uStack_50 = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex);
    p_Var1 = (this_00->
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      std::condition_variable::wait((unique_lock *)&this->notification);
    }
    else {
      std::function<void_()>::operator=
                ((function<void_()> *)&local_68,(function<void_()> *)(p_Var1 + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(this_00);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (p_Var1 != (_List_node_base *)this_00) {
      std::function<void_()>::operator()((function<void_()> *)&local_68);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  return;
}

Assistant:

void Executor::runThread() {
    while (!closed) {
        Task task;

        {
            std::unique_lock<std::mutex> lock(mutex);

            if (pendingTasks.empty()) {
                notification.wait(lock);
                continue;
            } else {
                task = pendingTasks.front();
                pendingTasks.pop_front();
            }
        }

        task();
    }
}